

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgtkn(fitsfile *fptr,int numkey,char *name,long *value,int *status)

{
  int iVar1;
  char local_188 [8];
  char message [81];
  char local_128 [8];
  char comm [73];
  char valuestring [71];
  char local_88 [8];
  char keyname [75];
  int *status_local;
  long *value_local;
  char *name_local;
  int numkey_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    local_88[0] = '\0';
    comm[0x48] = '\0';
    unique0x10000160 = status;
    iVar1 = ffgkyn(fptr,numkey,local_88,comm + 0x48,local_128,status);
    if (iVar1 < 1) {
      iVar1 = strcmp(local_88,name);
      if (iVar1 == 0) {
        ffc2ii(comm + 0x48,value,stack0xffffffffffffffc8);
        if ((0 < *stack0xffffffffffffffc8) || (*value < 0)) {
          *stack0xffffffffffffffc8 = 0xd1;
        }
      }
      else {
        *stack0xffffffffffffffc8 = 0xd0;
      }
      if (0 < *stack0xffffffffffffffc8) {
        snprintf(local_188,0x51,"ffgtkn found unexpected keyword or value for keyword no. %d.",
                 (ulong)(uint)numkey);
        ffpmsg(local_188);
        snprintf(local_188,0x51," Expected positive integer keyword %s, but instead",name);
        ffpmsg(local_188);
        snprintf(local_188,0x51," found keyword %s with value %s",local_88,comm + 0x48);
        ffpmsg(local_188);
      }
    }
    fptr_local._4_4_ = *stack0xffffffffffffffc8;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtkn(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           long *value,     /* O - integer value of the keyword   */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and get the
  integer value of the keyword.  Return an error if the keyword
  name does not match the input name, or if the value of the
  keyword is not a positive integer.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        else
        {
            ffc2ii(valuestring, value, status);  /* convert to integer */

            if (*status > 0 || *value < 0 )
               *status = NOT_POS_INT;
        }

        if (*status > 0)
        {
            snprintf(message, FLEN_ERRMSG,
              "ffgtkn found unexpected keyword or value for keyword no. %d.",
              numkey);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " Expected positive integer keyword %s, but instead", name);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " found keyword %s with value %s", keyname, valuestring);
            ffpmsg(message);
        }
    }

    return(*status);
}